

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS ref_collapse_post_uv_area(REF_GRID ref_grid,REF_INT node)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_NODE ref_node;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_INT cell;
  char *pcVar4;
  ulong uVar5;
  undefined8 uStack_e0;
  REF_DBL uv_area;
  REF_GEOM local_c0;
  REF_DBL area;
  REF_DBL sign_uv_area;
  REF_INT nodes [27];
  
  ref_cell = ref_grid->cell[3];
  uVar5 = 0xffffffff;
  cell = -1;
  if (-1 < node) {
    pRVar1 = ref_cell->ref_adj;
    uVar5 = 0xffffffff;
    cell = -1;
    if (node < pRVar1->nnode) {
      uVar3 = pRVar1->first[(uint)node];
      uVar5 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar3 != -1) {
        cell = pRVar1->item[(int)uVar3].ref;
        uVar5 = (ulong)uVar3;
      }
    }
  }
  ref_node = ref_grid->node;
  local_c0 = ref_grid->geom;
  while( true ) {
    if ((int)uVar5 == -1) {
      return 0;
    }
    uVar3 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar3 != 0) break;
    uVar3 = ref_node_tri_area(ref_node,nodes,&area);
    if (uVar3 != 0) {
      uVar5 = (ulong)uVar3;
      pcVar4 = "vol";
      uStack_e0 = 0x49;
      goto LAB_0015e74d;
    }
    uVar3 = ref_geom_uv_area(local_c0,nodes,&uv_area);
    if (uVar3 != 0) {
      uVar5 = (ulong)uVar3;
      pcVar4 = "uv area";
      uStack_e0 = 0x4a;
      goto LAB_0015e74d;
    }
    uVar3 = ref_geom_uv_area_sign(ref_grid,nodes[3],&sign_uv_area);
    if (uVar3 != 0) {
      uVar5 = (ulong)uVar3;
      pcVar4 = "sign";
      uStack_e0 = 0x4b;
      goto LAB_0015e74d;
    }
    uv_area = sign_uv_area * uv_area;
    if (uv_area < 1e-20) {
      printf("area %e uv area %e bool %d\n",area,(ulong)(uv_area < ref_node->min_uv_area));
      return 1;
    }
    pRVar2 = ref_cell->ref_adj->item;
    uVar5 = (ulong)pRVar2[(int)uVar5].next;
    cell = -1;
    if (uVar5 != 0xffffffffffffffff) {
      cell = pRVar2[uVar5].ref;
    }
  }
  uVar5 = (ulong)uVar3;
  pcVar4 = "cell nodes";
  uStack_e0 = 0x48;
LAB_0015e74d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
         uStack_e0,"ref_collapse_post_uv_area",uVar5,pcVar4);
  return (REF_STATUS)uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_post_uv_area(REF_GRID ref_grid, REF_INT node) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL sign_uv_area, uv_area, area;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
    RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
    RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
    uv_area *= sign_uv_area;
    if (uv_area < 1.0e-20) {
      printf("area %e uv area %e bool %d\n", area, uv_area,
             uv_area < ref_node_min_uv_area(ref_node));
      return REF_FAILURE;
    }
  }
  return REF_SUCCESS;
}